

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

sexp_conflict
sexp_25_send_file_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1,
          sexp_conflict arg2,sexp_conflict arg3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int *in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res4;
  sexp_conflict res;
  off_t tmp4;
  int err;
  long local_c0;
  long local_b8;
  long local_a8;
  long local_a0;
  int local_90;
  int local_80;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  sexp_conflict local_50;
  long local_48;
  int local_3c;
  int *local_38;
  int *local_30;
  int *local_28;
  undefined8 local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_3c = 0;
  local_58 = 0x43e;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_68,0,0x10);
  if (((((ulong)local_28 & 3) == 0) && (*local_28 == 0x12)) || (((ulong)local_28 & 1) == 1)) {
    if (((((ulong)local_30 & 3) == 0) && (*local_30 == 0x12)) || (((ulong)local_30 & 1) == 1)) {
      if ((((ulong)local_38 & 1) == 1) || ((((ulong)local_38 & 3) == 0 && (*local_38 == 0xc)))) {
        if ((((ulong)in_stack_00000008 & 1) == 1) ||
           ((((ulong)in_stack_00000008 & 3) == 0 && (*in_stack_00000008 == 0xc)))) {
          local_68 = &local_58;
          local_60 = *(undefined8 *)(local_10 + 0x6080);
          *(undefined8 ***)(local_10 + 0x6080) = &local_68;
          if ((((ulong)local_28 & 3) == 0) && (*local_28 == 0x12)) {
            local_80 = (int)*(undefined8 *)(local_28 + 4);
          }
          else {
            auVar1._8_8_ = (long)local_28 >> 0x3f;
            auVar1._0_8_ = (ulong)local_28 & 0xfffffffffffffffe;
            local_80 = SUB164(auVar1 / SEXT816(2),0);
          }
          if ((((ulong)local_30 & 3) == 0) && (*local_30 == 0x12)) {
            local_90 = (int)*(undefined8 *)(local_30 + 4);
          }
          else {
            auVar2._8_8_ = (long)local_30 >> 0x3f;
            auVar2._0_8_ = (ulong)local_30 & 0xfffffffffffffffe;
            local_90 = SUB164(auVar2 / SEXT816(2),0);
          }
          if (((ulong)local_38 & 1) == 1) {
            auVar3._8_8_ = (long)local_38 >> 0x3f;
            auVar3._0_8_ = (ulong)local_38 & 0xfffffffffffffffe;
            local_a0 = SUB168(auVar3 / SEXT816(2),0);
          }
          else {
            if ((((ulong)local_38 & 3) == 0) && (*local_38 == 0xc)) {
              local_a8 = (long)(char)local_38[2] * *(long *)(local_38 + 6);
            }
            else {
              local_a8 = 0;
            }
            local_a0 = local_a8;
          }
          if (((ulong)in_stack_00000008 & 1) == 1) {
            auVar4._8_8_ = (long)in_stack_00000008 >> 0x3f;
            auVar4._0_8_ = (ulong)in_stack_00000008 & 0xfffffffffffffffe;
            local_b8 = SUB168(auVar4 / SEXT816(2),0);
          }
          else {
            if ((((ulong)in_stack_00000008 & 3) == 0) && (*in_stack_00000008 == 0xc)) {
              local_c0 = (long)(char)in_stack_00000008[2] * *(long *)(in_stack_00000008 + 6);
            }
            else {
              local_c0 = 0;
            }
            local_b8 = local_c0;
          }
          local_3c = sexp_send_file(local_80,local_90,local_a0,local_b8,&local_48);
          if (local_3c == 0) {
            local_50 = (sexp_conflict)sexp_make_integer(local_10,local_48,local_48 >> 0x3f);
          }
          else {
            local_50 = (sexp_conflict)0x3e;
          }
          *(undefined8 *)(local_10 + 0x6080) = local_60;
          local_8 = local_50;
        }
        else {
          local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,2,in_stack_00000008);
        }
      }
      else {
        local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,2,local_38);
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,0x12,local_30);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,0x12,local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_25_send_file_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2, sexp arg3) {
  int err = 0;
  off_t tmp4;
  sexp res;
  sexp_gc_var1(res4);
  if (! (sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg0);
  if (! (sexp_filenop(arg1) || sexp_fixnump(arg1)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  if (! sexp_exact_integerp(arg3))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg3);
  sexp_gc_preserve1(ctx, res4);
  err = sexp_send_file((sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), (sexp_filenop(arg1) ? sexp_fileno_fd(arg1) : sexp_unbox_fixnum(arg1)), sexp_sint_value(arg2), sexp_sint_value(arg3), &tmp4);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res4 = sexp_make_integer(ctx, tmp4);
  res = res4;
  }
  sexp_gc_release1(ctx);
  return res;
}